

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O3

void evmap_signal_clear_(event_signal_map *ctx)

{
  int iVar1;
  void **ptr;
  long lVar2;
  
  ptr = ctx->entries;
  if (ptr != (void **)0x0) {
    iVar1 = ctx->nentries;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (ctx->entries[lVar2] != (void *)0x0) {
          event_mm_free_(ctx->entries[lVar2]);
          iVar1 = ctx->nentries;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
      ptr = ctx->entries;
    }
    event_mm_free_(ptr);
    ctx->entries = (void **)0x0;
  }
  ctx->nentries = 0;
  return;
}

Assistant:

void
evmap_signal_clear_(struct event_signal_map *ctx)
{
	if (ctx->entries != NULL) {
		int i;
		for (i = 0; i < ctx->nentries; ++i) {
			if (ctx->entries[i] != NULL)
				mm_free(ctx->entries[i]);
		}
		mm_free(ctx->entries);
		ctx->entries = NULL;
	}
	ctx->nentries = 0;
}